

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  undefined1 *puVar5;
  uv_udp_t *handle;
  long lVar6;
  ssize_t sVar7;
  long *plVar8;
  long lVar9;
  ulong uVar10;
  ssize_t sVar11;
  sockaddr_storage peer;
  uv__mmsghdr msgs [20];
  iovec iov [20];
  sockaddr_in6 peers [20];
  uv_buf_t local_990;
  uv_udp_t *local_980;
  uint local_978;
  int local_974;
  uv_buf_t local_970;
  msghdr local_960;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  uv__mmsghdr local_8a8 [20];
  long local_3a8;
  uint local_3a0 [78];
  undefined1 local_268 [568];
  
  if (*(int *)&w[-2].cb != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0xaf,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = (uv_udp_t *)&w[-3].pevents;
  if ((revents & 1) == 0) {
LAB_006b9081:
    if ((revents & 4) != 0) {
      uv__udp_sendmsg(handle);
      uv__udp_run_completed(handle);
    }
    return;
  }
  if (*(long *)&w[-1].fd == 0) {
    __assert_fail("handle->recv_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0xfe,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  lVar6._0_4_ = w[-1].pevents;
  lVar6._4_4_ = w[-1].events;
  local_978 = revents;
  if (lVar6 == 0) {
    __assert_fail("handle->alloc_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0xff,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  iVar1 = 0x20;
  local_980 = handle;
LAB_006b8d20:
  local_990 = uv_buf_init((char *)0x0,0);
  (**(code **)&w[-1].pevents)(handle,0x10000,&local_990);
  if ((local_990.base != (char *)0x0) && (local_990.len != 0)) {
    if (((*(byte *)((long)w[-1].pending_queue + 0xb) & 4) != 0) &&
       (uv_once(&once,uv__udp_mmsg_init), uv__recvmmsg_avail == '\x01')) {
      uVar10 = local_990.len >> 0x10;
      if (0x13 < uVar10) {
        uVar10 = 0x14;
      }
      if (0xffff < local_990.len) {
        puVar5 = local_268;
        lVar6 = 0;
        pcVar3 = local_990.base;
        do {
          plVar8 = (long *)((long)local_3a0 + lVar6 + -8);
          *plVar8 = (long)pcVar3;
          *(undefined8 *)((long)local_3a0 + lVar6) = 0x10000;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iov + lVar6 * 4) = 0;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iovlen + lVar6 * 4) = 0;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_name + lVar6 * 4) = 0;
          *(undefined8 *)(&local_8a8[0].msg_hdr.msg_namelen + lVar6) = 0;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_control + lVar6 * 4) = 0;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_controllen + lVar6 * 4) = 0;
          *(undefined8 *)(&local_8a8[0].msg_hdr.msg_flags + lVar6) = 0;
          *(long **)((long)&local_8a8[0].msg_hdr.msg_iov + lVar6 * 4) = plVar8;
          *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iovlen + lVar6 * 4) = 1;
          *(undefined1 **)((long)&local_8a8[0].msg_hdr.msg_name + lVar6 * 4) = puVar5;
          (&local_8a8[0].msg_hdr.msg_namelen)[lVar6] = 0x1c;
          (&local_8a8[0].msg_hdr.msg_flags)[lVar6] = 0;
          lVar6 = lVar6 + 0x10;
          puVar5 = puVar5 + 0x1c;
          pcVar3 = pcVar3 + 0x10000;
        } while (uVar10 << 4 != lVar6);
      }
      local_974 = iVar1;
      do {
        iVar1 = uv__recvmmsg(w->fd,local_8a8,(uint)uVar10);
        if (iVar1 != -1) {
          if (0 < iVar1) {
            lVar6 = (long)iVar1;
            lVar9 = 0;
            goto LAB_006b8f77;
          }
          if (iVar1 == 0) goto LAB_006b8e7e;
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          break;
        }
        piVar4 = __errno_location();
        iVar2 = *piVar4;
      } while (iVar2 == 4);
      if (iVar2 == 0xb) {
LAB_006b8e7e:
        lVar6 = 0;
      }
      else {
        lVar6 = (long)-iVar2;
      }
      (**(code **)&w[-1].fd)(handle,lVar6,&local_990);
      goto LAB_006b9016;
    }
    local_960.msg_controllen = 0;
    local_960.msg_flags = 0;
    local_960._52_4_ = 0;
    local_960.msg_control = (void *)0x0;
    local_8b8 = 0;
    uStack_8b0 = 0;
    local_8c8 = 0;
    uStack_8c0 = 0;
    local_8d8 = 0;
    uStack_8d0 = 0;
    local_8e8 = 0;
    uStack_8e0 = 0;
    local_8f8 = 0;
    uStack_8f0 = 0;
    local_908 = 0;
    uStack_900 = 0;
    local_918 = 0;
    uStack_910 = 0;
    local_928 = 0;
    uStack_920 = 0;
    local_960.msg_name = &local_928;
    local_960.msg_namelen = 0x80;
    local_960._12_4_ = 0;
    local_960.msg_iov = (iovec *)&local_990;
    local_960.msg_iovlen = 1;
    do {
      sVar11 = recvmsg(w->fd,&local_960,0);
      sVar7 = sVar11;
      if (sVar11 != -1) goto LAB_006b8f5e;
      piVar4 = __errno_location();
      iVar2 = *piVar4;
    } while ((long)iVar2 == 4);
    if (iVar2 == 0xb) {
      sVar7 = 0;
    }
    else {
      sVar7 = -(long)iVar2;
    }
LAB_006b8f5e:
    (**(code **)&w[-1].fd)(handle,sVar7,&local_990);
    iVar1 = iVar1 + -1;
    goto LAB_006b9035;
  }
  (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_990,0,0);
  revents = local_978;
  goto LAB_006b9081;
  while( true ) {
    local_970 = uv_buf_init(*(char **)((long)local_3a0 + lVar9 + -8),
                            *(uint *)((long)local_3a0 + lVar9));
    (**(code **)&w[-1].fd)(local_980,(&local_8a8[0].msg_len)[lVar9],&local_970);
    lVar9 = lVar9 + 0x10;
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) break;
LAB_006b8f77:
    if (*(long *)&w[-1].fd == 0) goto LAB_006b9016;
  }
  if (*(code **)&w[-1].fd != (code *)0x0) {
    (**(code **)&w[-1].fd)(local_980,0,&local_990);
  }
LAB_006b9016:
  sVar11 = (ssize_t)iVar1;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  iVar1 = local_974 - iVar1;
  handle = local_980;
LAB_006b9035:
  revents = local_978;
  if ((((sVar11 == -1) || (iVar1 < 1)) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0))
  goto LAB_006b9081;
  goto LAB_006b8d20;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}